

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O1

void * __thiscall
Diligent::FixedBlockMemoryAllocator::Allocate
          (FixedBlockMemoryAllocator *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  pointer pcVar3;
  MemoryPage *this_00;
  string msg;
  char (*in_stack_ffffffffffffffa8) [2];
  size_t local_50;
  string local_48;
  
  local_50 = Size;
  if (Size == 0) {
    FormatString<char[26],char[9]>
              (&local_48,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x3663fc,
               (char (*) [9])dbgFileName);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xd4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  local_50 = local_50 + 7 & 0xfffffffffffffff8;
  if (this->m_BlockSize != local_50) {
    FormatString<char[17],unsigned_long,char[34],unsigned_long,char[2]>
              (&local_48,(Diligent *)"Requested size (",(char (*) [17])&local_50,
               (unsigned_long *)") does not match the block size (",
               (char (*) [34])&this->m_BlockSize,(unsigned_long *)0x33e49a,in_stack_ffffffffffffffa8
              );
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0xd7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar2 == 0) {
    if ((this->m_AvailablePages)._M_h._M_element_count == 0) {
      CreateNewPage(this);
    }
    p_Var1 = (this->m_AvailablePages)._M_h._M_before_begin._M_nxt[1]._M_nxt;
    this_00 = (this->m_PagePool).
              super__Vector_base<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::STDAllocator<Diligent::FixedBlockMemoryAllocator::MemoryPage,_Diligent::IMemoryAllocator>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)p_Var1;
    pcVar3 = (pointer)MemoryPage::Allocate(this_00);
    local_48._M_dataplus._M_p = pcVar3;
    local_48._M_string_length = (size_type)p_Var1;
    std::
    _Hashtable<void*,std::pair<void*const,unsigned_long>,Diligent::STDAllocator<std::pair<void*const,unsigned_long>,Diligent::IMemoryAllocator>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<void*,unsigned_long>>
              ((_Hashtable<void*,std::pair<void*const,unsigned_long>,Diligent::STDAllocator<std::pair<void*const,unsigned_long>,Diligent::IMemoryAllocator>,std::__detail::_Select1st,std::equal_to<void*>,std::hash<void*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->m_AddrToPageId);
    if (this_00->m_NumFreeBlocks == 0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_Diligent::STDAllocator<unsigned_long,_Diligent::IMemoryAllocator>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::erase(&(this->m_AvailablePages)._M_h,
              (const_iterator)(this->m_AvailablePages)._M_h._M_before_begin._M_nxt);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return pcVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void* FixedBlockMemoryAllocator::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0);

    Size = AdjustBlockSize(Size);
    VERIFY(m_BlockSize == Size, "Requested size (", Size, ") does not match the block size (", m_BlockSize, ")");

    std::lock_guard<std::mutex> LockGuard(m_Mutex);

    if (m_AvailablePages.empty())
    {
        CreateNewPage();
    }

    auto  PageId = *m_AvailablePages.begin();
    auto& Page   = m_PagePool[PageId];
    auto* Ptr    = Page.Allocate();
    m_AddrToPageId.insert(std::make_pair(Ptr, PageId));
    if (!Page.HasSpace())
    {
        m_AvailablePages.erase(m_AvailablePages.begin());
    }

    return Ptr;
}